

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall cmCPackDebGenerator::PackageFiles(cmCPackDebGenerator *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  uint uVar2;
  ostream *this_01;
  char *msg;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCPackLog_msg;
  int retval;
  cmCPackDebGenerator *this_local;
  
  uVar2 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[0x18])();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackDeb.cmake");
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,&(this->super_cmCPackGenerator).files);
      this_local._4_4_ = createDeb(this);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_198);
      this_01 = std::operator<<((ostream *)local_198,"Error while execution CPackDeb.cmake");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      this_00 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(this_00,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x110,msg);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
      this_local._4_4_ = 0;
    }
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    this_local._4_4_ = PackageComponentsAllInOne(this);
  }
  else {
    this_local._4_4_ =
         PackageComponents(this,(this->super_cmCPackGenerator).componentPackageMethod ==
                                ONE_PACKAGE_PER_COMPONENT);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::PackageFiles()
{
  int retval = -1;

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL GROUPS or ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (componentPackageMethod == ONE_PACKAGE)
      {
      return PackageComponentsAllInOne();
      }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    else
      {
      return PackageComponents(componentPackageMethod ==
                               ONE_PACKAGE_PER_COMPONENT);
      }
  }
  // CASE 3 : NON COMPONENT package.
  else
    {
    if (!this->ReadListFile("CPackDeb.cmake"))
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error while execution CPackDeb.cmake" << std::endl);
      retval = 0;
      }
    else
      {
      packageFiles = files;
      return createDeb();
      }
    }
  return retval;
}